

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O1

Data * Integer::divide(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Data *pDVar1;
  _func_int **pp_Var2;
  Data *this;
  
  this = (Data *)operator_new(0x18);
  pDVar1 = *(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Data::Data(this);
  this->_vptr_Data = (_func_int **)&PTR__Integer_00109d28;
  pp_Var2 = pDVar1[1]._vptr_Data;
  this[1]._vptr_Data = pp_Var2;
  this[1]._vptr_Data =
       (_func_int **)
       ((long)pp_Var2 /
       (long)(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
             super__Vector_impl_data._M_start[1][1]._vptr_Data);
  return this;
}

Assistant:

Data *Integer::divide(std::vector<Data *> *dataPara) {
    auto result = new Integer(((Integer *) ((*dataPara)[0]))->value);
    result->value /= ((Integer *) ((*dataPara)[1]))->value;
    return result;
}